

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

PtrTokenOrSyntax * __thiscall
slang::syntax::DPIExportSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,DPIExportSyntax *this,size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  switch(this) {
  case (DPIExportSyntax *)0x0:
    return __return_storage_ptr__ + 2;
  case (DPIExportSyntax *)0x1:
    pPVar1 = __return_storage_ptr__ + 5;
    break;
  case (DPIExportSyntax *)0x2:
    pPVar1 = __return_storage_ptr__ + 6;
    break;
  case (DPIExportSyntax *)0x3:
    pPVar1 = __return_storage_ptr__ + 7;
    break;
  case (DPIExportSyntax *)0x4:
    pPVar1 = __return_storage_ptr__ + 8;
    break;
  case (DPIExportSyntax *)0x5:
    pPVar1 = __return_storage_ptr__ + 9;
    break;
  case (DPIExportSyntax *)0x6:
    pPVar1 = __return_storage_ptr__ + 10;
    break;
  case (DPIExportSyntax *)0x7:
    pPVar1 = __return_storage_ptr__ + 0xb;
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax DPIExportSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &keyword;
        case 2: return &specString;
        case 3: return &c_identifier;
        case 4: return &equals;
        case 5: return &functionOrTask;
        case 6: return &name;
        case 7: return &semi;
        default: return nullptr;
    }
}